

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.cpp
# Opt level: O0

Proto * luaF_newproto(lua_State *L)

{
  GCObject *o;
  Proto *f;
  lua_State *L_local;
  
  o = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x78);
  luaC_link(L,o,'\t');
  (o->h).metatable = (Table *)0x0;
  (o->p).sizek = 0;
  (o->h).node = (Node *)0x0;
  (o->p).sizep = 0;
  (o->h).array = (TValue *)0x0;
  (o->p).sizecode = 0;
  (o->p).sizelineinfo = 0;
  (o->p).sizeupvalues = 0;
  (o->p).nups = '\0';
  (o->p).upvalues = (TString **)0x0;
  (o->p).numparams = '\0';
  (o->p).is_vararg = '\0';
  (o->p).maxstacksize = '\0';
  (o->h).lastfree = (Node *)0x0;
  (o->p).sizelocvars = 0;
  (o->h).gclist = (GCObject *)0x0;
  (o->p).linedefined = 0;
  (o->p).lastlinedefined = 0;
  (o->p).source = (TString *)0x0;
  return (Proto *)o;
}

Assistant:

Proto *luaF_newproto (lua_State *L) {
  Proto *f = luaM_new(L, Proto);
  luaC_link(L, obj2gco(f), LUA_TPROTO);
  f->k = NULL;
  f->sizek = 0;
  f->p = NULL;
  f->sizep = 0;
  f->code = NULL;
  f->sizecode = 0;
  f->sizelineinfo = 0;
  f->sizeupvalues = 0;
  f->nups = 0;
  f->upvalues = NULL;
  f->numparams = 0;
  f->is_vararg = 0;
  f->maxstacksize = 0;
  f->lineinfo = NULL;
  f->sizelocvars = 0;
  f->locvars = NULL;
  f->linedefined = 0;
  f->lastlinedefined = 0;
  f->source = NULL;
  return f;
}